

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueArg.h
# Opt level: O2

void __thiscall
TCLAP::ValueArg<int>::ValueArg
          (ValueArg<int> *this,string *flag,string *name,string *desc,bool req,int val,
          string *typeDesc,Visitor *v)

{
  Arg::Arg(&this->super_Arg,flag,name,desc,req,true,v);
  (this->super_Arg)._vptr_Arg = (_func_int **)&PTR__ValueArg_00140b98;
  *(int *)&(this->super_Arg).field_0xa4 = val;
  this->_default = val;
  std::__cxx11::string::string((string *)&this->_typeDesc,(string *)typeDesc);
  this->_constraint = (Constraint<int> *)0x0;
  return;
}

Assistant:

ValueArg<T>::ValueArg(const std::string& flag, 
                      const std::string& name, 
                      const std::string& desc, 
                      bool req, 
                      T val,
                      const std::string& typeDesc,
                      Visitor* v)
: Arg(flag, name, desc, req, true, v),
  _value( val ),
  _default( val ),
  _typeDesc( typeDesc ),
  _constraint( NULL )
{ }